

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O1

void __thiscall
Assimp::M3DImporter::calculateOffsetMatrix(M3DImporter *this,aiNode *pNode,aiMatrix4x4 *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  if (pNode == (aiNode *)0x0) {
    __assert_fail("pNode != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x289,"void Assimp::M3DImporter::calculateOffsetMatrix(aiNode *, aiMatrix4x4 *)")
    ;
  }
  if (this->mScene != (aiScene *)0x0) {
    if (pNode->mParent != (aiNode *)0x0) {
      calculateOffsetMatrix(this,pNode->mParent,m);
      aiMatrix4x4t<float>::operator*=(m,&pNode->mTransformation);
      return;
    }
    fVar12 = (pNode->mTransformation).a1;
    fVar13 = (pNode->mTransformation).a2;
    fVar14 = (pNode->mTransformation).a3;
    fVar15 = (pNode->mTransformation).a4;
    fVar8 = (pNode->mTransformation).b1;
    fVar9 = (pNode->mTransformation).b2;
    fVar10 = (pNode->mTransformation).b3;
    fVar11 = (pNode->mTransformation).b4;
    fVar4 = (pNode->mTransformation).c1;
    fVar5 = (pNode->mTransformation).c2;
    fVar6 = (pNode->mTransformation).c3;
    fVar7 = (pNode->mTransformation).c4;
    fVar1 = (pNode->mTransformation).d2;
    fVar2 = (pNode->mTransformation).d3;
    fVar3 = (pNode->mTransformation).d4;
    m->d1 = (pNode->mTransformation).d1;
    m->d2 = fVar1;
    m->d3 = fVar2;
    m->d4 = fVar3;
    m->c1 = fVar4;
    m->c2 = fVar5;
    m->c3 = fVar6;
    m->c4 = fVar7;
    m->b1 = fVar8;
    m->b2 = fVar9;
    m->b3 = fVar10;
    m->b4 = fVar11;
    m->a1 = fVar12;
    m->a2 = fVar13;
    m->a3 = fVar14;
    m->a4 = fVar15;
    return;
  }
  __assert_fail("mScene != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                ,0x28a,"void Assimp::M3DImporter::calculateOffsetMatrix(aiNode *, aiMatrix4x4 *)");
}

Assistant:

void M3DImporter::calculateOffsetMatrix(aiNode *pNode, aiMatrix4x4 *m) {
	ai_assert(pNode != nullptr);
	ai_assert(mScene != nullptr);

	if (pNode->mParent) {
		calculateOffsetMatrix(pNode->mParent, m);
		*m *= pNode->mTransformation;
	} else {
		*m = pNode->mTransformation;
	}
}